

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

enable_if_t<has_member_tm_gmtoff<tm>::value,_std::tuple<std::tm,_std::time_t,_std::chrono::hours>_>
* google::anon_unknown_8::Breakdown<tm>
            (enable_if_t<has_member_tm_gmtoff<tm>::value,_std::tuple<std::tm,_std::time_t,_std::chrono::hours>_>
             *__return_storage_ptr__,time_point *now)

{
  duration<long,_std::ratio<1L,_1L>_> local_68;
  duration<long,_std::ratio<3600L,_1L>_> local_60;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<3600L>_>_> gmtoffset;
  tm tm;
  time_t timestamp;
  time_point *now_local;
  
  tm.tm_zone = (char *)std::chrono::_V2::system_clock::to_time_t(now);
  if ((fLB::FLAGS_log_utc_time & 1) == 0) {
    localtime_r((time_t *)&tm.tm_zone,(tm *)&gmtoffset);
  }
  else {
    gmtime_r((time_t *)&tm.tm_zone,(tm *)&gmtoffset);
  }
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_68,(long *)&tm.tm_isdst);
  local_60.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,long,std::ratio<1l,1l>>
                                (&local_68);
  std::make_tuple<tm&,long&,std::chrono::duration<long,std::ratio<3600l,1l>>const&>
            (__return_storage_ptr__,(tm *)&gmtoffset,(long *)&tm.tm_zone,&local_60);
  return __return_storage_ptr__;
}

Assistant:

auto Breakdown(const std::chrono::system_clock::time_point& now)
    -> std::enable_if_t<has_member_tm_gmtoff<T>::value,
                        std::tuple<std::tm, std::time_t, std::chrono::hours>> {
  std::time_t timestamp = std::chrono::system_clock::to_time_t(now);
  T tm;

  if (FLAGS_log_utc_time) {
    gmtime_r(&timestamp, &tm);
  } else {
    localtime_r(&timestamp, &tm);
  }

  const auto gmtoffset = std::chrono::duration_cast<std::chrono::hours>(
      std::chrono::seconds{tm.tm_gmtoff});

  return std::make_tuple(tm, timestamp, gmtoffset);
}